

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void __thiscall Chip8::CPU::reset(CPU *this)

{
  int local_14;
  CPU *local_10;
  CPU *this_local;
  
  this->_program_counter = 0x200;
  this->_delay_timer = '\0';
  this->_sound_timer = '\0';
  this->_stack_pointer = 0;
  this->_index_register = 0;
  local_14 = 0;
  local_10 = this;
  std::fill_n<unsigned_char*,unsigned_long,int>(this->_registers,0x10,&local_14);
  return;
}

Assistant:

void CPU::reset() {
        _program_counter = 0x200;
        _delay_timer = 0;
        _sound_timer = 0;
        _stack_pointer = 0;
        _index_register = 0;

        std::fill_n(_registers, sizeof(_registers), 0);
    }